

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

string * __thiscall
llvm::yaml::escape_abi_cxx11_
          (string *__return_storage_ptr__,yaml *this,StringRef Input,bool EscapePrintable)

{
  bool bVar1;
  long lVar2;
  iterator pcVar3;
  UTF8Decoded UVar4;
  size_t sVar5;
  ulong uVar6;
  undefined1 LowerCase;
  string *psVar7;
  StringRef string;
  allocator local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string HexStr_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  const_iterator local_140;
  undefined1 local_138 [8];
  SmallString<4U> Val;
  long local_118;
  uint local_10c;
  uint uStack_108;
  UTF8Decoded UnicodeScalarValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string HexStr;
  iterator e;
  iterator i;
  undefined1 auStack_68 [7];
  bool EscapePrintable_local;
  StringRef Input_local;
  string *EscapedInput;
  
  Input_local.Data = Input.Data;
  psVar7 = __return_storage_ptr__;
  _auStack_68 = this;
  Input_local.Length = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  e = StringRef::begin((StringRef *)auStack_68);
  HexStr.field_2._8_8_ = StringRef::end((StringRef *)auStack_68);
  do {
    if (e == (iterator)HexStr.field_2._8_8_) {
      return __return_storage_ptr__;
    }
    if (*e == '\\') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
    }
    else if (*e == '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
    }
    else if (*e == '\0') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\0");
    }
    else if (*e == '\a') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\a");
    }
    else if (*e == '\b') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
    }
    else if (*e == '\t') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
    }
    else if (*e == '\n') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
    }
    else if (*e == '\v') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\v");
    }
    else if (*e == '\f') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
    }
    else if (*e == '\r') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
    }
    else if (*e == '\x1b') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\e");
    }
    else if ((byte)*e < 0x20) {
      utohexstr_abi_cxx11_((string *)local_a0,(llvm *)(long)*e,0,SUB81(psVar7,0));
      lVar2 = std::__cxx11::string::size();
      std::allocator<char>::allocator();
      psVar7 = (string *)((long)&UnicodeScalarValue.first + 3);
      std::__cxx11::string::string
                ((string *)&UnicodeScalarValue.second,2 - lVar2,'0',(allocator *)psVar7);
      std::operator+(&local_e0,"\\x",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &UnicodeScalarValue.second);
      std::operator+(&local_c0,&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&UnicodeScalarValue.second);
      std::allocator<char>::~allocator((allocator<char> *)((long)&UnicodeScalarValue.first + 3));
      std::__cxx11::string::~string((string *)local_a0);
    }
    else if (((int)*e & 0x80U) == 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      pcVar3 = StringRef::end((StringRef *)auStack_68);
      lVar2 = (long)pcVar3 - (long)e;
      Val.super_SmallVector<char,_4U>._16_8_ = e;
      local_118 = lVar2;
      UVar4 = decodeUTF8(unique0x10000904);
      LowerCase = (undefined1)lVar2;
      uStack_108 = UVar4.second;
      if (uStack_108 == 0) {
        SmallString<4U>::SmallString((SmallString<4U> *)local_138);
        encodeUTF8(0xfffd,(SmallVectorImpl<char> *)local_138);
        local_148._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_140,&local_148);
        sVar5 = SmallVectorBase::size((SmallVectorBase *)local_138);
        std::__cxx11::string::insert<char*,void>
                  ((string *)__return_storage_ptr__,local_140,(char *)local_138,
                   (char *)((long)local_138 + sVar5));
        SmallString<4U>::~SmallString((SmallString<4U> *)local_138);
        return __return_storage_ptr__;
      }
      local_10c = UVar4.first;
      if (local_10c == 0x85) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\N");
      }
      else if (local_10c == 0xa0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\_");
      }
      else if (local_10c == 0x2028) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\L");
      }
      else if (local_10c == 0x2029) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\P");
      }
      else if ((((undefined1  [16])Input & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (bVar1 = sys::unicode::isPrintable(local_10c), bVar1)) {
        string.Length._0_4_ = uStack_108;
        string.Data = (char *)(ulong)uStack_108;
        string.Length._4_4_ = 0;
        llvm::operator+=((llvm *)__return_storage_ptr__,(string *)e,string);
      }
      else {
        utohexstr_abi_cxx11_
                  ((string *)local_188,(llvm *)((ulong)UVar4 & 0xffffffff),0,(bool)LowerCase);
        uVar6 = std::__cxx11::string::size();
        if (uVar6 < 3) {
          lVar2 = std::__cxx11::string::size();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e8,2 - lVar2,'0',&local_1e9);
          std::operator+(&local_1c8,"\\x",&local_1e8);
          std::operator+(&local_1a8,&local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
        else {
          uVar6 = std::__cxx11::string::size();
          if (uVar6 < 5) {
            lVar2 = std::__cxx11::string::size();
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_250,4 - lVar2,'0',&local_251);
            std::operator+(&local_230,"\\u",&local_250);
            std::operator+(&local_210,&local_230,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_188);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator((allocator<char> *)&local_251);
          }
          else {
            uVar6 = std::__cxx11::string::size();
            if (uVar6 < 9) {
              lVar2 = std::__cxx11::string::size();
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2b8,8 - lVar2,'0',&local_2b9);
              std::operator+(&local_298,"\\U",&local_2b8);
              std::operator+(&local_278,&local_298,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_188);
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_298);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
            }
          }
        }
        std::__cxx11::string::~string((string *)local_188);
      }
      psVar7 = (string *)(ulong)(uStack_108 - 1);
      e = e + (long)psVar7;
    }
    e = e + 1;
  } while( true );
}

Assistant:

std::string yaml::escape(StringRef Input, bool EscapePrintable) {
  std::string EscapedInput;
  for (StringRef::iterator i = Input.begin(), e = Input.end(); i != e; ++i) {
    if (*i == '\\')
      EscapedInput += "\\\\";
    else if (*i == '"')
      EscapedInput += "\\\"";
    else if (*i == 0)
      EscapedInput += "\\0";
    else if (*i == 0x07)
      EscapedInput += "\\a";
    else if (*i == 0x08)
      EscapedInput += "\\b";
    else if (*i == 0x09)
      EscapedInput += "\\t";
    else if (*i == 0x0A)
      EscapedInput += "\\n";
    else if (*i == 0x0B)
      EscapedInput += "\\v";
    else if (*i == 0x0C)
      EscapedInput += "\\f";
    else if (*i == 0x0D)
      EscapedInput += "\\r";
    else if (*i == 0x1B)
      EscapedInput += "\\e";
    else if ((unsigned char)*i < 0x20) { // Control characters not handled above.
      std::string HexStr = utohexstr(*i);
      EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
    } else if (*i & 0x80) { // UTF-8 multiple code unit subsequence.
      UTF8Decoded UnicodeScalarValue
        = decodeUTF8(StringRef(i, Input.end() - i));
      if (UnicodeScalarValue.second == 0) {
        // Found invalid char.
        SmallString<4> Val;
        encodeUTF8(0xFFFD, Val);
        EscapedInput.insert(EscapedInput.end(), Val.begin(), Val.end());
        // FIXME: Error reporting.
        return EscapedInput;
      }
      if (UnicodeScalarValue.first == 0x85)
        EscapedInput += "\\N";
      else if (UnicodeScalarValue.first == 0xA0)
        EscapedInput += "\\_";
      else if (UnicodeScalarValue.first == 0x2028)
        EscapedInput += "\\L";
      else if (UnicodeScalarValue.first == 0x2029)
        EscapedInput += "\\P";
      else if (!EscapePrintable &&
               sys::unicode::isPrintable(UnicodeScalarValue.first))
        EscapedInput += StringRef(i, UnicodeScalarValue.second);
      else {
        std::string HexStr = utohexstr(UnicodeScalarValue.first);
        if (HexStr.size() <= 2)
          EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 4)
          EscapedInput += "\\u" + std::string(4 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 8)
          EscapedInput += "\\U" + std::string(8 - HexStr.size(), '0') + HexStr;
      }
      i += UnicodeScalarValue.second - 1;
    } else
      EscapedInput.push_back(*i);
  }
  return EscapedInput;
}